

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O3

ArrayPtr<capnp::word> __thiscall
capnp::FlatMessageBuilder::allocateSegment(FlatMessageBuilder *this,uint minimumSize)

{
  Fault f;
  Fault local_10;
  
  if (this->allocated != true) {
    this->allocated = true;
    return this->array;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
             ,0x122,FAILED,"!allocated","\"FlatMessageBuilder\'s buffer was not large enough.\"",
             (char (*) [50])"FlatMessageBuilder\'s buffer was not large enough.");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

kj::ArrayPtr<word> FlatMessageBuilder::allocateSegment(uint minimumSize) {
  KJ_REQUIRE(!allocated, "FlatMessageBuilder's buffer was not large enough.");
  allocated = true;
  return array;
}